

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O0

int __thiscall Husky::ServerFrame::init(ServerFrame *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  SOCKET *unaff_retaddr;
  ServerFrame *in_stack_00000008;
  char *local_d8;
  char *local_c0;
  char *local_a8;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  ServerFrame *local_10;
  u_short in_stack_fffffffffffffffe;
  undefined1 uVar5;
  
  local_10 = this;
  bVar1 = BindToLocalHost(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffe);
  if (bVar1) {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
      ;
    }
    else {
      local_c0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
      local_c0 = local_c0 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"init ok {port:%d, threadNum:%d}",&local_69);
    Limonp::Logger::LoggingF
              (1,local_c0,0x51,(string *)local_68,(ulong)this->m_nLsnPort,
               (ulong)this->m_nThreadCount);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    uVar2 = (*this->m_pHandler->_vptr_IRequestHandler[2])();
    uVar4 = (ulong)uVar2;
    if ((uVar2 & 1) == 0) {
      pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                       ,0x2f);
      if (pcVar3 == (char *)0x0) {
        local_d8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
        ;
      }
      else {
        local_d8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                           ,0x2f);
        local_d8 = local_d8 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"m_pHandler init failed.",&local_91);
      Limonp::Logger::LoggingF(4,local_d8,0x55,(string *)local_90);
      std::__cxx11::string::~string(local_90);
      uVar4 = std::allocator<char>::~allocator((allocator<char> *)&local_91);
      uVar5 = 0;
    }
    else {
      uVar5 = 1;
    }
  }
  else {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
      ;
    }
    else {
      local_a8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
      local_a8 = local_a8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BindToLocalHost failed.",&local_31);
    Limonp::Logger::LoggingF(4,local_a8,0x4e,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    uVar4 = std::allocator<char>::~allocator((allocator<char> *)&local_31);
    uVar5 = 0;
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),uVar5);
}

Assistant:

virtual bool init()  
            {

                if (!BindToLocalHost(m_lsnSock,m_nLsnPort))
                {
                    LogFatal("BindToLocalHost failed.");
                    return false;
                }
                LogInfo("init ok {port:%d, threadNum:%d}", m_nLsnPort, m_nThreadCount);

                if(!m_pHandler->init())
                {
                    LogFatal("m_pHandler init failed.");
                    return false;
                }
                return true;
            }